

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regreftest.cc
# Opt level: O3

void __thiscall
lf::refinement::test::RegRefTest_BarycentricRef_Test::~RegRefTest_BarycentricRef_Test
          (RegRefTest_BarycentricRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RegRefTest, BarycentricRef) {
  std::cout << "TEST: Uniform barycentric refinement" << std::endl;
  // Generate test mesh
  auto mesh_p =
      lf::mesh::test_utils::GenerateHybrid2DTestMesh(testmesh_selector);
  // Output mesh information
  lf::mesh::utils::PrintInfo(std::cout, *mesh_p);
  // Build mesh hierarchy
  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  lf::refinement::MeshHierarchy multi_mesh(mesh_p, std::move(mesh_factory_ptr));

  multi_mesh.RefineRegular(lf::refinement::RefPat::rp_barycentric);

  std::shared_ptr<const mesh::Mesh> fine_mesh = multi_mesh.getMesh(1);

  std::cout << "Checking mesh completeness" << std::endl;
  lf::mesh::test_utils::checkMeshCompleteness(*fine_mesh);

  std::cout << "Checking geometry compatibulity: " << std::flush;
  lf::mesh::test_utils::WatertightLogger()->set_level(spdlog::level::trace);
  auto fails = lf::mesh::test_utils::isWatertightMesh(*fine_mesh, false);
  EXPECT_EQ(fails.size(), 0) << "Inconsistent geometry!";
  if (fails.empty()) {
    std::cout << "consistent!" << std::endl;
  } else {
    std::cout << "INCONSISTENT!" << std::endl;
    for (auto &geo_errs : fails) {
      std::cout << geo_errs.first.ToString() << "(" << geo_errs.second << ")"
                << std::endl;
    }
  }
  // Verify that child mesh is properly connected to father mesh
  checkFatherChildRelations(multi_mesh, 0);
  // Verify local child geometry representation
  checkGeometryInParent(multi_mesh, 0);

  std::cout << "Writing MATLAB file" << std::endl;
  io::writeMatlab(*fine_mesh, "barycentric_ref.m");

  std::cout << "Writing parent information" << std::endl;
  WriteMatlabLevel(multi_mesh, 1, "barycentric_ref_pi.m");

  // Printing mesh information
  lf::mesh::utils::PrintInfo(std::cout, *fine_mesh);
}